

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,char *s)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  allocator<char> local_71;
  string local_70 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_30;
  char *local_18;
  char *s_local;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this_local;
  
  local_18 = s;
  s_local = (char *)this;
  internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::MatcherBase
            (&this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>);
  __s = local_18;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_0018c4f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,__s,&local_71);
  Eq<std::__cxx11::string>(&local_50,(testing *)local_70,x);
  Matcher<std::basic_string_view<char,std::char_traits<char>>>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::basic_string_view<char,std::char_traits<char>>> *)&local_30,&local_50);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher(&local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}